

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skeleton_blocker_complex.cpp
# Opt level: O0

void __thiscall
test_skeleton_blocker_complex_link6::test_method(test_skeleton_blocker_complex_link6 *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  void *this_00;
  lazy_ostream *prev;
  basic_cstring<const_char> local_2d0;
  basic_cstring<const_char> local_2c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2b0;
  assertion_result local_290;
  basic_cstring<const_char> local_278;
  basic_cstring<const_char> local_268;
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [8];
  Skeleton_blocker_link_complex link_blocker_alpha;
  Vertex_handle local_138;
  Vertex_handle local_134;
  undefined1 local_130 [8];
  Simplex alpha;
  Vertex_handle local_f8;
  Vertex_handle local_f4;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  local_f0;
  undefined1 local_b0 [8];
  Complex complex;
  test_skeleton_blocker_complex_link6 *this_local;
  
  complex.blocker_map_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  Skeleton_blocker_complex
            ((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,0,(Visitor *)0x0);
  build_complete(4,(Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                    *)local_b0);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle(&local_f4,0)
  ;
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle(&local_f8,1)
  ;
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            ((Vertex_handle *)
             ((long)&alpha.simplex_set._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),2);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            (&local_f0,local_f4,local_f8,
             alpha.simplex_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_blocker
            ((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,&local_f0);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  ~Skeleton_blocker_simplex(&local_f0);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_134,0);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_138,1);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            ((Vertex_handle *)&link_blocker_alpha.field_0xd4,2);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *)local_130,local_134,local_138,(Vertex_handle)link_blocker_alpha._212_4_);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  ::Skeleton_blocker_link_complex
            ((Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
              *)local_218,false);
  Gudhi::skeleton_blocker::build_link_of_blocker
            ((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,(Simplex *)local_130,
             (Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
              *)local_218);
  poVar4 = std::operator<<((ostream *)&std::clog,"Complex: ");
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  to_string_abi_cxx11_
            ((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_238);
  poVar4 = std::operator<<(poVar4,(string *)local_238);
  this_00 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_238);
  poVar4 = std::operator<<((ostream *)&std::clog,"Link: ");
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  to_string_abi_cxx11_
            ((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_258);
  poVar4 = std::operator<<(poVar4,(string *)local_258);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_258);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
               ,0x81);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_278);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_268,0x22c,&local_278);
    iVar3 = Gudhi::skeleton_blocker::
            Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
            num_vertices((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                          *)local_218);
    boost::test_tools::assertion_result::assertion_result(&local_290,iVar3 == 1);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c0,"link_blocker_alpha.num_vertices() == 1",0x26);
    boost::unit_test::operator<<(&local_2b0,prev,&local_2c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
               ,0x81);
    boost::test_tools::tt_detail::report_assertion(&local_290,&local_2b0,&local_2d0,0x22c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2b0);
    boost::test_tools::assertion_result::~assertion_result(&local_290);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  ::~Skeleton_blocker_link_complex
            ((Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
              *)local_218);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  ~Skeleton_blocker_simplex
            ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *)local_130);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  ~Skeleton_blocker_complex
            ((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_skeleton_blocker_complex_link6) {
  Complex complex(0);
  // Build the complexes
  build_complete(4, complex);
  complex.add_blocker(Simplex(Vertex_handle(0), Vertex_handle(1), Vertex_handle(2)));

  Simplex alpha(Vertex_handle(0), Vertex_handle(1), Vertex_handle(2));

  Skeleton_blocker_link_complex link_blocker_alpha;

  build_link_of_blocker(complex, alpha, link_blocker_alpha);

  // Print result
  std::clog << "Complex: " << complex.to_string()<< std::endl << std::endl;
  std::clog << "Link: " << link_blocker_alpha.to_string() << std::endl;

  // verification
  BOOST_CHECK(link_blocker_alpha.num_vertices() == 1);
}